

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool wasEscaped(iterator First,iterator Position)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = Position + -1;
  pcVar1 = pcVar2;
  if (pcVar2 < First) {
    __assert_fail("Position - 1 >= First",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x4ed,"bool wasEscaped(StringRef::iterator, StringRef::iterator)");
  }
  do {
    if (*pcVar1 != '\\') break;
    pcVar1 = pcVar1 + -1;
  } while (First <= pcVar1);
  return ((long)pcVar2 - (long)pcVar1 & 0x8000000000000001U) == 1;
}

Assistant:

static bool wasEscaped(StringRef::iterator First,
                       StringRef::iterator Position) {
  assert(Position - 1 >= First);
  StringRef::iterator I = Position - 1;
  // We calculate the number of consecutive '\'s before the current position
  // by iterating backwards through our string.
  while (I >= First && *I == '\\') --I;
  // (Position - 1 - I) now contains the number of '\'s before the current
  // position. If it is odd, the character at 'Position' was escaped.
  return (Position - 1 - I) % 2 == 1;
}